

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O3

void __thiscall
ExprTest_NumberOfExpr_Test::~ExprTest_NumberOfExpr_Test(ExprTest_NumberOfExpr_Test *this)

{
  (this->super_ExprTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprTest_001a4a58;
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory(&(this->super_ExprTest).factory_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, NumberOfExpr) {
  auto arg0 = factory_.MakeVariable(0), arg1 = factory_.MakeVariable(1);
  auto builder = factory_.BeginNumberOf(2, arg0);
  builder.AddArg(arg1);
  auto expr = factory_.EndNumberOf(builder);
  EXPECT_EQ(2, expr.num_args());
  EXPECT_EQ(arg0, expr.arg(0));
  EXPECT_EQ(arg1, expr.arg(1));
}